

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ReservedFieldsDebugString2023_Test::
~ValidationErrorTest_ReservedFieldsDebugString2023_Test
          (ValidationErrorTest_ReservedFieldsDebugString2023_Test *this)

{
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018e2b28;
  DescriptorPool::~DescriptorPool(&(this->super_ValidationErrorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ReservedFieldsDebugString2023) {
  const FileDescriptor* file = BuildFile(R"pb(
    syntax: "editions"
    edition: EDITION_2023
    name: "foo.proto"
    message_type {
      name: "Foo"
      reserved_name: "foo"
      reserved_name: "bar"
      reserved_range { start: 5 end: 6 }
      reserved_range { start: 10 end: 20 }
    })pb");

  ASSERT_EQ(
      "edition = \"2023\";\n\n"
      "message Foo {\n"
      "  reserved 5, 10 to 19;\n"
      "  reserved foo, bar;\n"
      "}\n\n",
      file->DebugString());
}